

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::StrEqualityMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
          (StrEqualityMatcher<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  StrEqualityMatcher<std::__cxx11::string> SVar1;
  __type_conflict local_61;
  undefined1 local_40 [7];
  bool eq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s2;
  MatchResultListener *param_2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  s2.field_2._8_8_ = param_2;
  std::__cxx11::string::string((string *)local_40,(string *)s);
  if (((byte)this[0x21] & 1) == 0) {
    local_61 = CaseInsensitiveStringEquals<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)this);
  }
  else {
    local_61 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)this);
  }
  SVar1 = this[0x20];
  std::__cxx11::string::~string((string *)local_40);
  return (__type_conflict)((byte)SVar1 & 1) == local_61;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    const StringType s2(s);
    const bool eq = case_sensitive_ ? s2 == string_ :
        CaseInsensitiveStringEquals(s2, string_);
    return expect_eq_ == eq;
  }